

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

text * __thiscall lest::env::context_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  text local_38;
  
  sections_abi_cxx11_(&local_38,this);
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_38,0,(char *)0x0,(ulong)(this->testing)._M_dataplus._M_p
                             );
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

text context() { return testing + sections(); }